

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::addTarget
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *targetValue,
          double positionWeight,double rotationWeight)

{
  index_type iVar1;
  MatrixView<const_double> *in_RDX;
  MatrixView<const_double> *in_RSI;
  InverseKinematics *in_RDI;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  MatrixView<const_double> *this_00;
  bool local_151;
  MatrixView<const_double> *in_stack_fffffffffffffeb8;
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffffec0;
  MatrixFixSize local_120 [128];
  Transform local_a0 [103];
  bool local_39;
  undefined4 local_38;
  undefined4 local_34;
  MatrixView<const_double> *local_18;
  bool local_1;
  
  local_34 = 4;
  local_38 = 4;
  this_00 = in_RDX;
  local_18 = in_RSI;
  iVar1 = MatrixView<const_double>::rows(in_RDX);
  local_151 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<const_double>::cols(this_00);
    local_151 = iVar1 == 4;
  }
  local_39 = local_151;
  if (local_151 == false) {
    iDynTree::reportError("InverseKinematics","addTarget","Wrong size in input targetValue");
    local_1 = false;
  }
  else {
    MatrixView<const_double>::MatrixView(in_RDX,local_18);
    MatrixFixSize<4U,_4U>::MatrixFixSize(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    iDynTree::Transform::Transform(local_a0,local_120);
    local_1 = addTarget(in_RDI,(string *)this_00,(Transform *)in_RDX,(double)local_18,
                        7.33801119172795e-318);
  }
  return local_1;
}

Assistant:

bool InverseKinematics::addTarget(const std::string& frameName,
                                      iDynTree::MatrixView<const double> targetValue,
                                      const double positionWeight,
                                      const double rotationWeight)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (targetValue.rows() == expected_transform_rows)
                  && (targetValue.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "addTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->addTarget(frameName, Transform(targetValue), positionWeight, rotationWeight);
    }